

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O0

char * anon_unknown.dwarf_346899::Lookup
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                  *dummy_lh,char *key)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_68 [3];
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  iterator iter;
  char *key_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
  *dummy_lh_local;
  
  iter._M_node = (_Base_ptr)key;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,key,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
       ::find(dummy_lh,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
       ::end(dummy_lh);
  bVar1 = std::operator==(&local_28,local_68);
  if (bVar1) {
    dummy_lh_local =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
          *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
             ::operator->(&local_28);
    dummy_lh_local =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
          *)std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&ppVar2->second);
  }
  return (char *)dummy_lh_local;
}

Assistant:

static const char *Lookup(
    std::map<std::string, std::unique_ptr<char[]>> *dummy_lh, const char *key) {
  // Using operator[] implicitly inserts into the map.
  auto iter = dummy_lh->find(key);
  if (iter == dummy_lh->end()) {
    return nullptr;
  }
  return iter->second.get();
}